

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

big_integer *
anon_unknown.dwarf_afea::extract_random_element<big_integer>
          (big_integer *__return_storage_ptr__,vector<big_integer,_std::allocator<big_integer>_> *v)

{
  pointer pbVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = rand();
  pbVar1 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)(long)iVar2 %
          (ulong)((long)(v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
  big_integer::big_integer(__return_storage_ptr__,pbVar1 + uVar3);
  std::swap<big_integer>
            ((v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
             super__Vector_impl_data._M_finish + -1,
             (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
             super__Vector_impl_data._M_start + uVar3);
  std::vector<big_integer,_std::allocator<big_integer>_>::pop_back(v);
  return __return_storage_ptr__;
}

Assistant:

T extract_random_element(std::vector<T> &v) {
        size_t index = rand() % v.size();
        T copy = v[index];
        erase_unordered(v, v.begin() + index);
        return copy;
    }